

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretMain.c
# Opt level: O3

void print_node2(Abc_Obj_t *pObj)

{
  uint uVar1;
  size_t sVar2;
  long lVar3;
  char m [6];
  char local_26 [6];
  
  uVar1 = *(uint *)&pObj->field_0x14;
  if ((uVar1 & 0x10) != 0) {
    sVar2 = strlen(local_26);
    (local_26 + sVar2)[0] = 'A';
    (local_26 + sVar2)[1] = '\0';
  }
  if ((uVar1 & 0x20) != 0) {
    sVar2 = strlen(local_26);
    (local_26 + sVar2)[0] = 'B';
    (local_26 + sVar2)[1] = '\0';
  }
  if ((uVar1 & 0x40) != 0) {
    sVar2 = strlen(local_26);
    (local_26 + sVar2)[0] = 'C';
    (local_26 + sVar2)[1] = '\0';
  }
  printf("node %d type=%d %s fanouts {",(ulong)(uint)pObj->Id,(ulong)(uVar1 & 0xf),local_26);
  if (0 < (pObj->vFanouts).nSize) {
    lVar3 = 0;
    do {
      printf("%d ,",(ulong)*(uint *)((long)pObj->pNtk->vObjs->pArray[(pObj->vFanouts).pArray[lVar3]]
                                    + 0x10));
      lVar3 = lVar3 + 1;
    } while (lVar3 < (pObj->vFanouts).nSize);
  }
  printf("} fanins {");
  if (0 < (pObj->vFanins).nSize) {
    lVar3 = 0;
    do {
      printf("%d ,",(ulong)*(uint *)((long)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar3]]
                                    + 0x10));
      lVar3 = lVar3 + 1;
    } while (lVar3 < (pObj->vFanins).nSize);
  }
  printf("} ");
  return;
}

Assistant:

void
print_node2(Abc_Obj_t *pObj) {
  int i;
  Abc_Obj_t * pNext;
  char m[6];

  m[0] = 0;
  if (pObj->fMarkA)
    strcat(m, "A");
  if (pObj->fMarkB)
    strcat(m, "B");
  if (pObj->fMarkC)
    strcat(m, "C");

  printf("node %d type=%d %s fanouts {", Abc_ObjId(pObj), Abc_ObjType(pObj), m);
  Abc_ObjForEachFanout( pObj, pNext, i )
    printf("%d ,", Abc_ObjId(pNext));
  printf("} fanins {");
  Abc_ObjForEachFanin( pObj, pNext, i )
    printf("%d ,", Abc_ObjId(pNext));
  printf("} ");
}